

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O0

WebPAnimEncoder *
WebPAnimEncoderNewInternal(int width,int height,WebPAnimEncoderOptions *enc_options,int abi_version)

{
  int iVar1;
  WebPAnimEncoder *enc_00;
  EncodedFrame *pEVar2;
  WebPMux *pWVar3;
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  int in_EDI;
  WebPAnimEncoder *enc;
  undefined4 in_stack_ffffffffffffffe0;
  
  if ((((in_ECX >> 8 == 1) && (0 < in_EDI)) && (0 < in_ESI)) &&
     (((ulong)((long)in_EDI * (long)in_ESI) < 0x100000000 &&
      (enc_00 = (WebPAnimEncoder *)
                WebPSafeCalloc((uint64_t)in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffe0)),
      enc_00 != (WebPAnimEncoder *)0x0)))) {
    MarkNoError(enc_00);
    enc_00->canvas_width_ = in_EDI;
    enc_00->canvas_height_ = in_ESI;
    if (in_RDX == (void *)0x0) {
      DefaultEncoderOptions((WebPAnimEncoderOptions *)0x19f599);
    }
    else {
      memcpy(&enc_00->options_,in_RDX,0x2c);
      SanitizeEncoderOptions((WebPAnimEncoderOptions *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
    }
    iVar1 = WebPPictureInit((WebPPicture *)0x19f5a9);
    if (((iVar1 != 0) && (iVar1 = WebPPictureInit((WebPPicture *)0x19f5be), iVar1 != 0)) &&
       (iVar1 = WebPPictureInit((WebPPicture *)0x19f5d3), iVar1 != 0)) {
      (enc_00->curr_canvas_copy_).width = in_EDI;
      (enc_00->curr_canvas_copy_).height = in_ESI;
      (enc_00->curr_canvas_copy_).use_argb = 1;
      iVar1 = WebPPictureAlloc((WebPPicture *)enc_00);
      if (((iVar1 != 0) &&
          (iVar1 = WebPPictureCopy((WebPPicture *)enc_00,(WebPPicture *)0x19f637), iVar1 != 0)) &&
         (iVar1 = WebPPictureCopy((WebPPicture *)enc_00,(WebPPicture *)0x19f657), iVar1 != 0)) {
        WebPUtilClearPic((WebPPicture *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                         (FrameRectangle *)enc_00);
        enc_00->curr_canvas_copy_modified_ = 1;
        ResetCounters(enc_00);
        enc_00->size_ = (long)(((enc_00->options_).kmax - (enc_00->options_).kmin) + 1);
        if (enc_00->size_ < 2) {
          enc_00->size_ = 2;
        }
        pEVar2 = (EncodedFrame *)
                 WebPSafeCalloc((uint64_t)in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
        enc_00->encoded_frames_ = pEVar2;
        if (enc_00->encoded_frames_ != (EncodedFrame *)0x0) {
          pWVar3 = WebPMuxNew();
          enc_00->mux_ = pWVar3;
          if (enc_00->mux_ != (WebPMux *)0x0) {
            enc_00->count_since_key_frame_ = 0;
            enc_00->first_timestamp_ = 0;
            enc_00->prev_timestamp_ = 0;
            enc_00->prev_candidate_undecided_ = 0;
            enc_00->is_first_frame_ = 1;
            enc_00->got_null_frame_ = 0;
            return enc_00;
          }
        }
      }
    }
    WebPAnimEncoderDelete((WebPAnimEncoder *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  }
  return (WebPAnimEncoder *)0x0;
}

Assistant:

WebPAnimEncoder* WebPAnimEncoderNewInternal(
    int width, int height, const WebPAnimEncoderOptions* enc_options,
    int abi_version) {
  WebPAnimEncoder* enc;

  if (WEBP_ABI_IS_INCOMPATIBLE(abi_version, WEBP_MUX_ABI_VERSION)) {
    return NULL;
  }
  if (width <= 0 || height <= 0 ||
      (width * (uint64_t)height) >= MAX_IMAGE_AREA) {
    return NULL;
  }

  enc = (WebPAnimEncoder*)WebPSafeCalloc(1, sizeof(*enc));
  if (enc == NULL) return NULL;
  MarkNoError(enc);

  // Dimensions and options.
  *(int*)&enc->canvas_width_ = width;
  *(int*)&enc->canvas_height_ = height;
  if (enc_options != NULL) {
    *(WebPAnimEncoderOptions*)&enc->options_ = *enc_options;
    SanitizeEncoderOptions((WebPAnimEncoderOptions*)&enc->options_);
  } else {
    DefaultEncoderOptions((WebPAnimEncoderOptions*)&enc->options_);
  }

  // Canvas buffers.
  if (!WebPPictureInit(&enc->curr_canvas_copy_) ||
      !WebPPictureInit(&enc->prev_canvas_) ||
      !WebPPictureInit(&enc->prev_canvas_disposed_)) {
    goto Err;
  }
  enc->curr_canvas_copy_.width = width;
  enc->curr_canvas_copy_.height = height;
  enc->curr_canvas_copy_.use_argb = 1;
  if (!WebPPictureAlloc(&enc->curr_canvas_copy_) ||
      !WebPPictureCopy(&enc->curr_canvas_copy_, &enc->prev_canvas_) ||
      !WebPPictureCopy(&enc->curr_canvas_copy_, &enc->prev_canvas_disposed_)) {
    goto Err;
  }
  WebPUtilClearPic(&enc->prev_canvas_, NULL);
  enc->curr_canvas_copy_modified_ = 1;

  // Encoded frames.
  ResetCounters(enc);
  // Note: one extra storage is for the previous frame.
  enc->size_ = enc->options_.kmax - enc->options_.kmin + 1;
  // We need space for at least 2 frames. But when kmin, kmax are both zero,
  // enc->size_ will be 1. So we handle that special case below.
  if (enc->size_ < 2) enc->size_ = 2;
  enc->encoded_frames_ =
      (EncodedFrame*)WebPSafeCalloc(enc->size_, sizeof(*enc->encoded_frames_));
  if (enc->encoded_frames_ == NULL) goto Err;

  enc->mux_ = WebPMuxNew();
  if (enc->mux_ == NULL) goto Err;

  enc->count_since_key_frame_ = 0;
  enc->first_timestamp_ = 0;
  enc->prev_timestamp_ = 0;
  enc->prev_candidate_undecided_ = 0;
  enc->is_first_frame_ = 1;
  enc->got_null_frame_ = 0;

  return enc;  // All OK.

 Err:
  WebPAnimEncoderDelete(enc);
  return NULL;
}